

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  DisplayConsole local_1f0;
  DisplayConsole disp_1;
  DisplayNCurses disp;
  SatLookAngles TLEsAndLAs;
  string local_138;
  undefined1 local_118 [8];
  DBSQLite db;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_79;
  string local_78;
  char *local_58;
  char *optStr;
  int refreshRate;
  int opt;
  char *dbFile;
  char *sourceFile;
  bool gui;
  double dStack_30;
  bool verbose;
  double lon;
  double lat;
  double alt;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  lat = 0.0;
  lon = 0.0;
  dStack_30 = 0.0;
  sourceFile._7_1_ = 0;
  sourceFile._6_1_ = 0;
  dbFile = (char *)0x0;
  _refreshRate = "./.satnow.sql3";
  optStr._0_4_ = -1;
  local_58 = "ghva:d:r:u:x:y:";
  alt = (double)argv;
  argv_local._0_4_ = argc;
  while (optStr._4_4_ = getopt_long((int)argv_local,alt,local_58,opts,0), pcVar1 = _optarg,
        0 < optStr._4_4_) {
    switch(optStr._4_4_) {
    case 0x61:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b0,pcVar1,&local_b1);
      lat = std::__cxx11::stod(&local_b0,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"[-] Unknown command line option.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(1);
    case 100:
      _refreshRate = _optarg;
      break;
    case 0x67:
      sourceFile._6_1_ = 1;
      break;
    case 0x68:
      usage(*(char **)alt);
    case 0x72:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_78,pcVar1,&local_79);
      optStr._0_4_ = std::__cxx11::stoi(&local_78,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      break;
    case 0x75:
      dbFile = _optarg;
      break;
    case 0x76:
      sourceFile._7_1_ = 1;
      break;
    case 0x78:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d8,pcVar1,&local_d9);
      lon = std::__cxx11::stod(&local_d8,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      break;
    case 0x79:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_100,pcVar1,(allocator *)((long)&db._sql + 7));
      dStack_30 = std::__cxx11::stod(&local_100,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)((long)&db._sql + 7));
    }
  }
  if ((((90.0 < lon) || (lon < -90.0)) || (180.0 < dStack_30)) || (dStack_30 < -180.0)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[-] Invalid coordinates (latitude: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,lon);
    poVar3 = std::operator<<(poVar3,", longitude: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dStack_30);
    poVar3 = std::operator<<(poVar3,')');
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"[+] Using viewer position (latitude: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,lon);
    poVar3 = std::operator<<(poVar3,", longitude: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dStack_30);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,", altitude: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,lat);
    poVar3 = std::operator<<(poVar3,')');
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    if (_refreshRate == (char *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "[-] The database path must not be empty (see --help).");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"[+] Using database: ");
      poVar3 = std::operator<<(poVar3,_refreshRate);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      DBSQLite::DBSQLite((DBSQLite *)local_118,_refreshRate);
      bVar2 = DBSQLite::ok((DBSQLite *)local_118);
      if (bVar2) {
        if (dbFile != (char *)0x0) {
          update(dbFile,(DB *)local_118,(bool)(sourceFile._7_1_ & 1));
        }
        getSatellitesAndLookAngles
                  ((SatLookAngles *)&disp._refreshSecs,lon,dStack_30,lat,(DB *)local_118);
        if ((sourceFile._6_1_ & 1) == 0) {
          DisplayConsole::DisplayConsole(&local_1f0);
          DisplayConsole::render(&local_1f0,(SatLookAngles *)&disp._refreshSecs);
        }
        else {
          DisplayNCurses::DisplayNCurses((DisplayNCurses *)&disp_1,(int)optStr);
          DisplayNCurses::render((DisplayNCurses *)&disp_1,(SatLookAngles *)&disp._refreshSecs);
          DisplayNCurses::~DisplayNCurses((DisplayNCurses *)&disp_1);
        }
        argv_local._4_4_ = 0;
        SatLookAngles::~SatLookAngles((SatLookAngles *)&disp._refreshSecs);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"[-] Error opening database \'");
        poVar3 = std::operator<<(poVar3,_refreshRate);
        poVar3 = std::operator<<(poVar3,"\': ");
        DBSQLite::getErrorString_abi_cxx11_(&local_138,(DBSQLite *)local_118);
        poVar3 = std::operator<<(poVar3,(string *)&local_138);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_138);
        argv_local._4_4_ = 1;
      }
      DBSQLite::~DBSQLite((DBSQLite *)local_118);
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  double alt = 0.0, lat = 0.0, lon = 0.0;
  bool verbose = false, gui = false;
  const char *sourceFile = nullptr, *dbFile = DEFAULT_DB_PATH;
  int opt, refreshRate = -1;
  const char *optStr = "ghva:d:r:u:x:y:";
  while ((opt = getopt_long(argc, argv, optStr, opts, nullptr)) > 0) {
    switch (opt) {
#if HAVE_GUI
    case 'g':
      gui = true;
      break;
    case 'r':
      refreshRate = std::stoi(optarg);
      break;
#endif
    case 'h':
      usage(argv[0]);
      break;
    case 'v':
      verbose = true;
      break;
    case 'a':
      alt = std::stod(optarg);
      break;
    case 'd':
      dbFile = optarg;
      break;
    case 'u':
      sourceFile = optarg;
      break;
    case 'x':
      lat = std::stod(optarg);
      break;
    case 'y':
      lon = std::stod(optarg);
      break;
    default:
      std::cerr << "[-] Unknown command line option." << std::endl;
      exit(EXIT_FAILURE);
      break;
    }
  }

  // Ensure we have valid coords.
  if (lat > 90.0 || lat < -90.0 || lon > 180.0 || lon < -180.0) {
    std::cerr << "[-] Invalid coordinates (latitude: " << lat
              << ", longitude: " << lon << ')' << std::endl;
    return EXIT_FAILURE;
  }
  std::cout << "[+] Using viewer position (latitude: " << lat
            << ", longitude: " << lon << ", "
            << ", altitude: " << alt << ')' << std::endl;

  // Open the database that contains the TLE data.
  if (!dbFile) {
    std::cerr << "[-] The database path must not be empty (see --help)."
              << std::endl;
    return EXIT_FAILURE;
  }
  std::cout << "[+] Using database: " << dbFile << std::endl;

  DBSQLite db(dbFile);
  if (!db.ok()) {
    std::cerr << "[-] Error opening database '" << dbFile
              << "': " << db.getErrorString() << std::endl;
    return EXIT_FAILURE;
  }

  // If a source file is specified, then update the existing database.
  if (sourceFile)
    update(sourceFile, db, verbose);

  // Calculate and display.
  auto TLEsAndLAs = getSatellitesAndLookAngles(lat, lon, alt, db);
  if (gui) {
    DisplayNCurses disp(refreshRate);
    disp.render(TLEsAndLAs);
  } else {
    DisplayConsole disp;
    disp.render(TLEsAndLAs);
  }

  return 0;
}